

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

command_result_status
bgp_neighbor_route_command
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *command_params,bgp_peer *peer)

{
  adj_ribs_in_data *args_2;
  in_addr_t __netlong;
  uint32_t address;
  size_type sVar1;
  char *pcVar2;
  node<adj_ribs_in_data> *pnVar3;
  string local_88;
  char *local_68;
  in_addr_t local_60;
  in_addr_t local_5c;
  char acStack_58 [8];
  char next_hop [16];
  char prefix [16];
  node<adj_ribs_in_data> *res;
  size_t param_count;
  bgp_peer *peer_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_params_local;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(command_params);
  if (sVar1 < 5) {
    command_params_local._4_4_ = INVALID_PARAMS;
  }
  else {
    pnVar3 = peer->adj_ribs_in;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](command_params,4);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    __netlong = inet_addr(pcVar2);
    address = ntohl(__netlong);
    pnVar3 = search_prefix<adj_ribs_in_data>(pnVar3,address,' ',false);
    if (((pnVar3->is_prefix & 1U) != 0) && (pnVar3->data != (adj_ribs_in_data *)0x0)) {
      local_5c = htonl(pnVar3->prefix);
      pcVar2 = inet_ntoa((in_addr)local_5c);
      next_hop._8_8_ = *(undefined8 *)pcVar2;
      local_60 = htonl((pnVar3->data->path_attr).next_hop);
      pcVar2 = inet_ntoa((in_addr)local_60);
      acStack_58 = *(char (*) [8])pcVar2;
      next_hop._0_8_ = *(undefined8 *)(pcVar2 + 8);
      args_2 = pnVar3->data;
      console<char[16],unsigned_char,unsigned_char,char[16],unsigned_int,unsigned_int,unsigned_char>
                ("%s/%d  origin %d, nexthop %s, med %d, local-pref %d, peer %d",
                 (char (*) [16])(next_hop + 8),&pnVar3->prefix_len,(uchar *)args_2,
                 (char (*) [16])acStack_58,&(args_2->path_attr).med,&(args_2->path_attr).local_pref,
                 &peer->index);
      as_path_to_string_abi_cxx11_
                (&local_88,(pnVar3->data->path_attr).as_path,
                 (pnVar3->data->path_attr).as_path_length);
      local_68 = (char *)std::__cxx11::string::c_str();
      console<char_const*,unsigned_char>
                ("as-path %s, length %d",&local_68,&(pnVar3->data->path_attr).as_path_length);
      std::__cxx11::string::~string((string *)&local_88);
    }
    command_params_local._4_4_ = SUCCESS;
  }
  return command_params_local._4_4_;
}

Assistant:

command_result_status bgp_neighbor_route_command(const std::vector<std::string>& command_params, bgp_peer* peer){
    size_t param_count = command_params.size();
    if(param_count < 5){
        return command_result_status::INVALID_PARAMS;
    }

    node<adj_ribs_in_data>* res = search_prefix(peer->adj_ribs_in, ntohl(inet_addr(command_params[4].c_str())));
    char prefix[16];

    char next_hop[16];
    if(res->is_prefix and res->data != nullptr){ // TODO is_prefixがtrueでdataがnullptrの時がどのような場合かよく考える
        memcpy(&prefix, inet_ntoa(in_addr{.s_addr = htonl(res->prefix)}), 16);
        memcpy(&next_hop, inet_ntoa(in_addr{.s_addr = htonl(res->data->path_attr.next_hop)}), 16);
        console("%s/%d  origin %d, nexthop %s, med %d, local-pref %d, peer %d", prefix, res->prefix_len,
                res->data->path_attr.origin, next_hop, res->data->path_attr.med,
                res->data->path_attr.local_pref, peer->index);
        console("as-path %s, length %d", as_path_to_string(res->data->path_attr.as_path, res->data->path_attr.as_path_length).c_str(), res->data->path_attr.as_path_length);
    }

    return command_result_status::SUCCESS;
}